

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O1

uint64_t __thiscall
GmmLib::GmmResourceInfoCommon::GetDriverProtectionBits
          (GmmResourceInfoCommon *this,GMM_OVERRIDE_VALUES OverrideData)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  ulong uVar5;
  undefined8 uStack_28;
  bool IscompressionEn;
  
  uStack_28 = in_RAX;
  iVar2 = (*this->pClientContext->_vptr_GmmClientContext[0x10])();
  if (*(int *)CONCAT44(extraout_var,iVar2) < 0x4f7) {
    uVar4 = 0;
  }
  else {
    uVar5 = (ulong)OverrideData & 0xffffffff;
    if (0x11c < OverrideData.Usage - 1) {
      uVar5 = (ulong)(this->Surf).CachePolicy.Usage;
    }
    iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    uStack_28._7_1_ =
         (*(ulong *)(CONCAT44(extraout_var_00,iVar2) + 0x1c) >> 0x22 & 1) != 0 &&
         (OverrideData.CompressionDis == '\0' && ((ulong)(this->Surf).Flags.Info >> 0x2d & 1) == 0);
    iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])(this);
    plVar1 = *(long **)(CONCAT44(extraout_var_01,iVar2) + 0x35e0);
    uVar3 = (**(code **)(*plVar1 + 0x28))
                      (plVar1,0,uVar5,(long)&uStack_28 + 7,
                       (*(uint *)&(this->Surf).Flags.Info & 4) >> 2);
    uVar4 = (ulong)(uVar3 & 0x1f) | (ulong)uStack_28._7_1_ << 0x1f;
  }
  return uVar4;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED uint64_t GMM_STDCALL GetDriverProtectionBits(GMM_OVERRIDE_VALUES OverrideData)
	    {
	        GMM_DRIVERPROTECTION     DriverProtection = {{0}};
	        const GMM_PLATFORM_INFO *pPlatform;
	        GMM_RESOURCE_USAGE_TYPE  Usage;

	        pPlatform = (GMM_PLATFORM_INFO *)GMM_OVERRIDE_EXPORTED_PLATFORM_INFO(&Surf, GetGmmLibContext());
	        if (GFX_GET_CURRENT_PRODUCT(pPlatform->Platform) < IGFX_PVC)
	        {
	            return 0;
	        }
	        Usage = Surf.CachePolicy.Usage;
	        if ((OverrideData.Usage > GMM_RESOURCE_USAGE_UNKNOWN) && (OverrideData.Usage < GMM_RESOURCE_USAGE_MAX)) 
	        {
	            Usage = (GMM_RESOURCE_USAGE_TYPE)OverrideData.Usage;
	        }
	        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
	        {
	            if (OverrideData.CompressionDis)
	            {
	                DriverProtection.CompressionEnReq = 0;
	            }
	            else
	            {

	                DriverProtection.CompressionEnReq = !Surf.Flags.Info.NotCompressed;
	            }
	        }

	        bool IscompressionEn              = DriverProtection.CompressionEnReq ? true : false;
	        DriverProtection.CacheableNoSnoop = false;

	        DriverProtection.PATIndex = GetGmmLibContext()->GetCachePolicyObj()->CachePolicyGetPATIndex(NULL, Usage, &IscompressionEn, (bool)(Surf.Flags.Info.Cacheable));

	        DriverProtection.CompressionEnReq = IscompressionEn ? true : false;

	        return DriverProtection.Value;
	    }